

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmWhile(ExpressionContext *ctx,VmModule *module,ExprWhile *node)

{
  VmBlock *expr;
  VmModule *ctx_00;
  ExprBase **this;
  VmValue *pVVar1;
  VmValue *condition;
  VmBlock *local_38;
  VmBlock *exitBlock;
  VmBlock *bodyBlock;
  VmBlock *conditionBlock;
  ExprWhile *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  conditionBlock = (VmBlock *)node;
  node_local = (ExprWhile *)module;
  module_local = (VmModule *)ctx;
  bodyBlock = anon_unknown.dwarf_1a3010::CreateBlock
                        (module,(node->super_ExprBase).source,"while_cond");
  exitBlock = anon_unknown.dwarf_1a3010::CreateBlock
                        ((VmModule *)node_local,*(SynBase **)&(conditionBlock->super_VmValue).type,
                         "while_body");
  local_38 = anon_unknown.dwarf_1a3010::CreateBlock
                       ((VmModule *)node_local,*(SynBase **)&(conditionBlock->super_VmValue).type,
                        "while_exit");
  this = &node_local->body;
  VmModule::LoopInfo::LoopInfo((LoopInfo *)&condition,local_38,bodyBlock);
  SmallArray<VmModule::LoopInfo,_32U>::push_back
            ((SmallArray<VmModule::LoopInfo,_32U> *)this,(LoopInfo *)&condition);
  anon_unknown.dwarf_1a3010::CreateJump
            ((VmModule *)node_local,*(SynBase **)&(conditionBlock->super_VmValue).type,
             &bodyBlock->super_VmValue);
  VmFunction::AddBlock(*(VmFunction **)&(node_local->super_ExprBase).listed,bodyBlock);
  node_local->condition = (ExprBase *)bodyBlock;
  pVVar1 = CompileVm((ExpressionContext *)module_local,(VmModule *)node_local,
                     (ExprBase *)(conditionBlock->super_VmValue).comment.end);
  anon_unknown.dwarf_1a3010::CreateJumpNotZero
            ((VmModule *)node_local,*(SynBase **)&(conditionBlock->super_VmValue).type,pVVar1,
             &exitBlock->super_VmValue,&local_38->super_VmValue);
  VmFunction::AddBlock(*(VmFunction **)&(node_local->super_ExprBase).listed,exitBlock);
  node_local->condition = (ExprBase *)exitBlock;
  CompileVm((ExpressionContext *)module_local,(VmModule *)node_local,
            *(ExprBase **)&(conditionBlock->super_VmValue).hasSideEffects);
  anon_unknown.dwarf_1a3010::CreateJump
            ((VmModule *)node_local,*(SynBase **)&(conditionBlock->super_VmValue).type,
             &bodyBlock->super_VmValue);
  VmFunction::AddBlock(*(VmFunction **)&(node_local->super_ExprBase).listed,local_38);
  node_local->condition = (ExprBase *)local_38;
  SmallArray<VmModule::LoopInfo,_32U>::pop_back
            ((SmallArray<VmModule::LoopInfo,_32U> *)&node_local->body);
  ctx_00 = module_local;
  expr = conditionBlock;
  pVVar1 = anon_unknown.dwarf_1a3010::CreateVoid((VmModule *)node_local);
  pVVar1 = anon_unknown.dwarf_1a3010::CheckType((ExpressionContext *)ctx_00,(ExprBase *)expr,pVVar1)
  ;
  return pVVar1;
}

Assistant:

VmValue* CompileVmWhile(ExpressionContext &ctx, VmModule *module, ExprWhile *node)
{
	VmBlock *conditionBlock = CreateBlock(module, node->source, "while_cond");
	VmBlock *bodyBlock = CreateBlock(module, node->source, "while_body");
	VmBlock *exitBlock = CreateBlock(module, node->source, "while_exit");

	module->loopInfo.push_back(VmModule::LoopInfo(exitBlock, conditionBlock));

	CreateJump(module, node->source, conditionBlock);

	module->currentFunction->AddBlock(conditionBlock);
	module->currentBlock = conditionBlock;

	VmValue* condition = CompileVm(ctx, module, node->condition);

	CreateJumpNotZero(module, node->source, condition, bodyBlock, exitBlock);

	module->currentFunction->AddBlock(bodyBlock);
	module->currentBlock = bodyBlock;

	CompileVm(ctx, module, node->body);

	CreateJump(module, node->source, conditionBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	module->loopInfo.pop_back();

	return CheckType(ctx, node, CreateVoid(module));
}